

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

ssize_t __thiscall
Liby::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  element_type *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  function<void_()> local_88;
  shared_ptr<Liby::Buffer> local_68;
  undefined1 local_58 [8];
  io_task task;
  BasicHandler *handler_local;
  Buffer *buf_local;
  Connection *this_local;
  
  task.handler_._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
        )(__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
          )__buf;
  io_task::io_task((io_task *)local_58);
  local_88._M_invoker =
       (_Invoker_type)Buffer::capacity((Buffer *)CONCAT44(in_register_00000034,__fd));
  std::make_shared<Liby::Buffer,long>((long *)&local_68);
  std::shared_ptr<Liby::Buffer>::operator=((shared_ptr<Liby::Buffer> *)&task.len_,&local_68);
  std::shared_ptr<Liby::Buffer>::~shared_ptr(&local_68);
  this_00 = std::__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&task.len_);
  Buffer::swap(this_00,(Buffer *)CONCAT44(in_register_00000034,__fd));
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)
                     task.handler_._M_t.
                     super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                     .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl);
  if (bVar1) {
    std::make_unique<std::function<void()>,std::function<void()>const&>(&local_88);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    operator=((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
              &task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ,(unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
               &local_88);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *
                )&local_88);
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)local_58);
  enableWrit(this,true);
  io_task::~io_task((io_task *)local_58);
  return extraout_RAX;
}

Assistant:

void Connection::send(Buffer &buf, const BasicHandler &handler) {
    io_task task;
    task.buffer_ = std::make_shared<Buffer>(buf.capacity());
    task.buffer_->swap(buf);
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}